

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::initializeEonww(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar2;
  time_t now;
  allocator<char> local_49;
  string local_48;
  
  previous = Pig::cursor(pig);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"eonww",&local_49);
  bVar1 = Pig::skipLiteral(pig,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    c = Pig::peek(pig);
    bVar1 = unicodeLatinAlpha(c);
    if ((!bVar1) && (bVar1 = unicodeLatinDigit(c), !bVar1)) {
      local_48._M_dataplus._M_p = (pointer)time((time_t *)0x0);
      __tp = localtime((time_t *)&local_48);
      __tp->tm_mday = (__tp->tm_mday - __tp->tm_wday) + 0xd;
      __tp->tm_hour = 0;
      __tp->tm_sec = -1;
      __tp->tm_min = 0;
      __tp->tm_isdst = -1;
      tVar2 = mktime(__tp);
      this->_date = tVar2;
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::initializeEonww (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skipLiteral ("eonww"))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_mday += 13 - t->tm_wday;
      t->tm_hour = t->tm_min = 0;
      t->tm_sec = -1;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}